

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

Optimizer * __thiscall
spvtools::Optimizer::RegisterLegalizationPasses(Optimizer *this,bool preserve_interface)

{
  Optimizer *pOVar1;
  PassToken local_108;
  PassToken local_100;
  PassToken local_f8;
  PassToken local_f0;
  PassToken local_e8;
  PassToken local_e0;
  PassToken local_d8;
  PassToken local_d0;
  PassToken local_c8;
  PassToken local_c0;
  PassToken local_b8;
  PassToken local_b0;
  PassToken local_a8;
  PassToken local_a0;
  PassToken local_98;
  PassToken local_90;
  PassToken local_88;
  PassToken local_80;
  PassToken local_78;
  PassToken local_70;
  PassToken local_68;
  PassToken local_60;
  PassToken local_58;
  PassToken local_50;
  PassToken local_48;
  PassToken local_40;
  PassToken local_38;
  PassToken local_30;
  PassToken local_28;
  PassToken local_20;
  byte local_11;
  Optimizer *pOStack_10;
  bool preserve_interface_local;
  Optimizer *this_local;
  
  local_11 = preserve_interface;
  pOStack_10 = this;
  CreateWrapOpKillPass();
  pOVar1 = RegisterPass(this,&local_20);
  CreateDeadBranchElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_28);
  CreateMergeReturnPass();
  pOVar1 = RegisterPass(pOVar1,&local_30);
  CreateInlineExhaustivePass();
  pOVar1 = RegisterPass(pOVar1,&local_38);
  CreateEliminateDeadFunctionsPass();
  pOVar1 = RegisterPass(pOVar1,&local_40);
  CreatePrivateToLocalPass();
  pOVar1 = RegisterPass(pOVar1,&local_48);
  CreateFixStorageClassPass();
  pOVar1 = RegisterPass(pOVar1,&local_50);
  CreateLocalSingleBlockLoadStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_58);
  CreateLocalSingleStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_60);
  CreateAggressiveDCEPass((spvtools *)&local_68,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_68);
  CreateScalarReplacementPass((spvtools *)&local_70,0);
  pOVar1 = RegisterPass(pOVar1,&local_70);
  CreateLocalSingleBlockLoadStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_78);
  CreateLocalSingleStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_80);
  CreateAggressiveDCEPass((spvtools *)&local_88,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_88);
  CreateLocalMultiStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_90);
  CreateAggressiveDCEPass((spvtools *)&local_98,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_98);
  CreateCCPPass();
  pOVar1 = RegisterPass(pOVar1,&local_a0);
  CreateLoopUnrollPass((spvtools *)&local_a8,true,0);
  pOVar1 = RegisterPass(pOVar1,&local_a8);
  CreateDeadBranchElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_b0);
  CreateSimplificationPass();
  pOVar1 = RegisterPass(pOVar1,&local_b8);
  CreateAggressiveDCEPass((spvtools *)&local_c0,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_c0);
  CreateCopyPropagateArraysPass();
  pOVar1 = RegisterPass(pOVar1,&local_c8);
  CreateVectorDCEPass();
  pOVar1 = RegisterPass(pOVar1,&local_d0);
  CreateDeadInsertElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_d8);
  CreateReduceLoadSizePass((spvtools *)&local_e0,0.9);
  pOVar1 = RegisterPass(pOVar1,&local_e0);
  CreateAggressiveDCEPass((spvtools *)&local_e8,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_e8);
  CreateRemoveUnusedInterfaceVariablesPass();
  pOVar1 = RegisterPass(pOVar1,&local_f0);
  CreateInterpolateFixupPass();
  pOVar1 = RegisterPass(pOVar1,&local_f8);
  CreateInvocationInterlockPlacementPass();
  pOVar1 = RegisterPass(pOVar1,&local_100);
  CreateOpExtInstWithForwardReferenceFixupPass();
  pOVar1 = RegisterPass(pOVar1,&local_108);
  PassToken::~PassToken(&local_108);
  PassToken::~PassToken(&local_100);
  PassToken::~PassToken(&local_f8);
  PassToken::~PassToken(&local_f0);
  PassToken::~PassToken(&local_e8);
  PassToken::~PassToken(&local_e0);
  PassToken::~PassToken(&local_d8);
  PassToken::~PassToken(&local_d0);
  PassToken::~PassToken(&local_c8);
  PassToken::~PassToken(&local_c0);
  PassToken::~PassToken(&local_b8);
  PassToken::~PassToken(&local_b0);
  PassToken::~PassToken(&local_a8);
  PassToken::~PassToken(&local_a0);
  PassToken::~PassToken(&local_98);
  PassToken::~PassToken(&local_90);
  PassToken::~PassToken(&local_88);
  PassToken::~PassToken(&local_80);
  PassToken::~PassToken(&local_78);
  PassToken::~PassToken(&local_70);
  PassToken::~PassToken(&local_68);
  PassToken::~PassToken(&local_60);
  PassToken::~PassToken(&local_58);
  PassToken::~PassToken(&local_50);
  PassToken::~PassToken(&local_48);
  PassToken::~PassToken(&local_40);
  PassToken::~PassToken(&local_38);
  PassToken::~PassToken(&local_30);
  PassToken::~PassToken(&local_28);
  PassToken::~PassToken(&local_20);
  return pOVar1;
}

Assistant:

Optimizer& Optimizer::RegisterLegalizationPasses(bool preserve_interface) {
  return
      // Wrap OpKill instructions so all other code can be inlined.
      RegisterPass(CreateWrapOpKillPass())
          // Remove unreachable block so that merge return works.
          .RegisterPass(CreateDeadBranchElimPass())
          // Merge the returns so we can inline.
          .RegisterPass(CreateMergeReturnPass())
          // Make sure uses and definitions are in the same function.
          .RegisterPass(CreateInlineExhaustivePass())
          // Make private variable function scope
          .RegisterPass(CreateEliminateDeadFunctionsPass())
          .RegisterPass(CreatePrivateToLocalPass())
          // Fix up the storage classes that DXC may have purposely generated
          // incorrectly.  All functions are inlined, and a lot of dead code has
          // been removed.
          .RegisterPass(CreateFixStorageClassPass())
          // Propagate the value stored to the loads in very simple cases.
          .RegisterPass(CreateLocalSingleBlockLoadStoreElimPass())
          .RegisterPass(CreateLocalSingleStoreElimPass())
          .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
          // Split up aggregates so they are easier to deal with.
          .RegisterPass(CreateScalarReplacementPass(0))
          // Remove loads and stores so everything is in intermediate values.
          // Takes care of copy propagation of non-members.
          .RegisterPass(CreateLocalSingleBlockLoadStoreElimPass())
          .RegisterPass(CreateLocalSingleStoreElimPass())
          .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
          .RegisterPass(CreateLocalMultiStoreElimPass())
          .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
          // Propagate constants to get as many constant conditions on branches
          // as possible.
          .RegisterPass(CreateCCPPass())
          .RegisterPass(CreateLoopUnrollPass(true))
          .RegisterPass(CreateDeadBranchElimPass())
          // Copy propagate members.  Cleans up code sequences generated by
          // scalar replacement.  Also important for removing OpPhi nodes.
          .RegisterPass(CreateSimplificationPass())
          .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
          .RegisterPass(CreateCopyPropagateArraysPass())
          // May need loop unrolling here see
          // https://github.com/Microsoft/DirectXShaderCompiler/pull/930
          // Get rid of unused code that contain traces of illegal code
          // or unused references to unbound external objects
          .RegisterPass(CreateVectorDCEPass())
          .RegisterPass(CreateDeadInsertElimPass())
          .RegisterPass(CreateReduceLoadSizePass())
          .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
          .RegisterPass(CreateRemoveUnusedInterfaceVariablesPass())
          .RegisterPass(CreateInterpolateFixupPass())
          .RegisterPass(CreateInvocationInterlockPlacementPass())
          .RegisterPass(CreateOpExtInstWithForwardReferenceFixupPass());
}